

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

int64_t node::UpdateTime(CBlockHeader *pblock,Params *consensusParams,CBlockIndex *pindexPrev)

{
  long lVar1;
  uint uVar2;
  int64_t iVar3;
  time_point tVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = pblock->nTime;
  iVar3 = CBlockIndex::GetMedianTimePast(pindexPrev);
  tVar4 = NodeClock::now();
  lVar6 = (long)tVar4.__d.__r / 1000000000;
  if ((long)tVar4.__d.__r / 1000000000 < iVar3 + 1) {
    lVar6 = iVar3 + 1;
  }
  if (((consensusParams->enforce_BIP94 == true) &&
      (((long)pindexPrev->nHeight + 1) %
       (consensusParams->nPowTargetTimespan / consensusParams->nPowTargetSpacing) == 0)) &&
     (lVar5 = (ulong)pindexPrev->nTime - 600, lVar6 <= lVar5)) {
    lVar6 = lVar5;
  }
  lVar5 = lVar6 - (ulong)uVar2;
  if (lVar5 != 0 && (long)(ulong)uVar2 <= lVar6) {
    pblock->nTime = (uint32_t)lVar6;
  }
  if (consensusParams->fPowAllowMinDifficultyBlocks == true) {
    uVar2 = GetNextWorkRequired(pindexPrev,pblock,consensusParams);
    pblock->nBits = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar5;
  }
  __stack_chk_fail();
}

Assistant:

int64_t UpdateTime(CBlockHeader* pblock, const Consensus::Params& consensusParams, const CBlockIndex* pindexPrev)
{
    int64_t nOldTime = pblock->nTime;
    int64_t nNewTime{std::max<int64_t>(pindexPrev->GetMedianTimePast() + 1, TicksSinceEpoch<std::chrono::seconds>(NodeClock::now()))};

    if (consensusParams.enforce_BIP94) {
        // Height of block to be mined.
        const int height{pindexPrev->nHeight + 1};
        if (height % consensusParams.DifficultyAdjustmentInterval() == 0) {
            nNewTime = std::max<int64_t>(nNewTime, pindexPrev->GetBlockTime() - MAX_TIMEWARP);
        }
    }

    if (nOldTime < nNewTime) {
        pblock->nTime = nNewTime;
    }

    // Updating time can change work required on testnet:
    if (consensusParams.fPowAllowMinDifficultyBlocks) {
        pblock->nBits = GetNextWorkRequired(pindexPrev, pblock, consensusParams);
    }

    return nNewTime - nOldTime;
}